

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer.cc
# Opt level: O2

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *this_00;
  pointer *this_01;
  int iVar1;
  RNNBuilder *this_02;
  pointer pvVar2;
  pointer pvVar3;
  pointer pEVar4;
  pointer ppNVar5;
  Node *pNVar6;
  int *piVar7;
  VariableIndex VVar8;
  ulong uVar9;
  Tensor *pTVar10;
  long lVar11;
  ulong uVar12;
  undefined8 extraout_RDX;
  uint uVar13;
  ulong uVar14;
  ulong __n;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 extraout_var [56];
  undefined1 auVar22 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar25;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  undefined7 in_stack_00000019;
  char in_stack_00000020;
  vector<float,_std::allocator<float>_> dist;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  uint local_398;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  initializer_list<cnn::expr::Expression> local_338;
  ComputationGraph *local_328;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  Expression i_l;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  
  pvVar2 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_328 = cg;
  cnn::RNNBuilder::new_graph((RNNBuilder *)this_00,(ComputationGraph *)cor);
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)this_00,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  this_01 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  cnn::RNNBuilder::new_graph((RNNBuilder *)this_01,(ComputationGraph *)cor);
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)this_01,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  uVar14 = (long)pvVar2 - (long)pvVar3 >> 2;
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding_2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding_1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding_2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding_1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charw2charh,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charhbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charh2xMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_word2xMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_xMExpbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_xMExp2xExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_oh2ohxMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&oh2ohxMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_u,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_oh2lh,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_lhbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_lh2l,(Parameters *)cor);
  __n = uVar14 & 0xffffffff;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_word,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_char,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charw,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charh,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charxMExp,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charxExp,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_charSum,__n,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charPool,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_charinput,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_input,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_inputw,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&fwds,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&revs,__n,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_oh,__n,(allocator_type *)&dist);
  uVar9 = uVar14 & 0xffffffff;
  errs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  auVar21 = ZEXT1664((undefined1  [16])
                     errs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._0_16_);
  for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
    cnn::expr::lookup((ComputationGraph *)&dist,(LookupParameters *)cor,
                      (uint)(sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
    i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
    .super__Vector_impl_data._M_start[uVar16].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
    .super__Vector_impl_data._M_start[uVar16].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    if (::eval == false) {
      auVar21 = ZEXT464((uint)pdrop);
      cnn::expr::dropout((expr *)&dist,
                         i_word.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar16,pdrop);
      i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar16].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar16].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
    }
    pvVar2 = (labels->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)*(pointer *)
                      ((long)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2);
    for (uVar13 = 0; uVar17 = (ulong)uVar13,
        pvVar2 = (labels->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)*(pointer *)
                                ((long)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data >> 2); uVar13 = uVar13 + 1) {
      cnn::expr::lookup((ComputationGraph *)&dist,(LookupParameters *)cor,
                        (uint)(sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish);
      pEVar4 = i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4[uVar17].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      pEVar4[uVar17].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
      if (::eval == false) {
        auVar21 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)&dist,
                           i_char.
                           super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar17,pdrop);
        pEVar4 = i_char.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4[uVar17].pg =
             (ComputationGraph *)
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        pEVar4[uVar17].i.t =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish._0_4_;
      }
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charw.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charxMExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    lVar15 = 0;
    uVar17 = 0;
    while( true ) {
      dVar19 = auVar21._0_8_;
      pEVar4 = i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4;
      uVar12 = lVar11 >> 4;
      if (uVar12 <= uVar17) break;
      if (lVar15 == 0) {
        if (uVar12 < 2) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else if (lVar11 == 0x20) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4->pg = (ComputationGraph *)
                     CONCAT44(alpha_i.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)alpha_i.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        (pEVar4->i).t =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (lVar15 == 0x10) {
        if (uVar12 < 3) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else if (lVar11 == 0x30) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4[1].pg = (ComputationGraph *)
                       CONCAT44(alpha_i.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)alpha_i.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        pEVar4[1].i.t =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (uVar17 + 1 < uVar12) {
          if (uVar17 + 2 < uVar12) {
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
            oh.i.t = 5;
            oh._12_4_ = 0;
            oh.pg = (ComputationGraph *)&dist;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
          }
          else {
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
            oh.i.t = 5;
            oh._12_4_ = 0;
            oh.pg = (ComputationGraph *)&dist;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
          }
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pEVar4->pg + lVar15) =
             CONCAT44(alpha_i.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)alpha_i.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        *(uint *)((long)&(pEVar4->i).t + lVar15) =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)i_charw2charh.pg;
      input_cols.i.t = 3;
      input_cols._12_4_ = 0;
      input_cols.pg = (ComputationGraph *)&dist;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&oh,(initializer_list<cnn::expr::Expression> *)&input_cols);
      dVar19 = cnn::expr::tanh((expr *)&alpha_i,dVar19);
      pEVar4 = i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pEVar4->pg + lVar15) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = i_xMExpbias.i.t;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)i_xMExpbias.pg;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)i_charh2xMExp.pg;
      input_cols.i.t = 5;
      input_cols._12_4_ = 0;
      input_cols.pg = (ComputationGraph *)&dist;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&oh,(initializer_list<cnn::expr::Expression> *)&input_cols);
      dVar19 = cnn::expr::tanh((expr *)&alpha_i,dVar19);
      pEVar4 = i_charxMExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pEVar4->pg + lVar15) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      cnn::expr::operator*
                ((expr *)&alpha_i,&i_xMExp2xExp,
                 (Expression *)
                 ((long)&(i_charxMExp.
                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15));
      auVar21._0_8_ = cnn::expr::exp((expr *)&dist,dVar19);
      auVar21._8_56_ = extraout_var;
      uVar17 = uVar17 + 1;
      pEVar4 = i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&pEVar4->pg + lVar15) =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
      lVar15 = lVar15 + 0x10;
    }
    cnn::expr::detail::
    f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((detail *)&dist,
               i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16);
    i_charSum.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_charSum.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    for (uVar13 = 0; uVar17 = (ulong)uVar13,
        uVar17 < (ulong)((long)i_char.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)i_char.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar13 = uVar13 + 1)
    {
      pEVar4 = i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      cnn::expr::cdiv((expr *)&alpha_i,
                      i_charxExp.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17,
                      i_charSum.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar16);
      cnn::expr::cwise_multiply((expr *)&dist,pEVar4 + uVar17,(Expression *)&alpha_i);
      pEVar4 = i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4[uVar17].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      pEVar4[uVar17].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
    }
    cnn::expr::detail::
    f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((detail *)&dist,
               i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16);
    i_charinput.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_charinput.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
  }
  lVar15 = uVar9 << 4;
  for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = *(undefined4 *)
              ((long)&((i_charinput.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = *(pointer *)
            ((long)&(i_charinput.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          ((long)&(i_word.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11);
    oh.i.t = 2;
    oh._12_4_ = 0;
    oh.pg = (ComputationGraph *)&dist;
    cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
    *(ulong *)((long)&(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11) =
         CONCAT44(alpha_i.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  (uint)alpha_i.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    *(uint *)((long)&((i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11) =
         (uint)alpha_i.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  uVar16 = 2;
  for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
    local_398 = (uint)uVar14;
    if (lVar11 == 0) {
      if (local_398 < 2) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else if (local_398 == 2) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      (i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
       _M_impl.super__Vector_impl_data._M_start)->pg =
           (ComputationGraph *)
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      ((i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start)->i).t =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else if (lVar11 == 0x10) {
      if (local_398 < 3) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else if (local_398 < 4) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[1].pg =
           (ComputationGraph *)
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[1].i.t =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (uVar16 - 1 < uVar9) {
        if (uVar16 < uVar9) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ =
               *(undefined4 *)
                ((long)i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      ((long)&i_input.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar11);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               *(pointer *)
                ((long)&i_input.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar11);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ =
               *(undefined4 *)
                ((long)i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      ((long)&i_input.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar11);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               *(pointer *)
                ((long)&i_input.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar11);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             *(undefined4 *)
              ((long)i_input.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x18);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)
                    ((long)&i_input.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar11);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             *(pointer *)
              ((long)&i_input.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar11);
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      *(ulong *)((long)&(i_inputw.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&((i_inputw.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    uVar16 = uVar16 + 1;
  }
  for (lVar11 = 0; uVar16 = uVar9, lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
    cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_00);
    *(pointer *)
     ((long)&(fwds.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11) =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(uint *)((long)&((fwds.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11) =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
  }
  while( true ) {
    uVar14 = uVar14 - 1;
    if (uVar16 == 0) break;
    cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_01);
    revs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14 & 0xffffffff].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    revs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14 & 0xffffffff].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    uVar16 = uVar16 - 1;
  }
  for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = *(undefined4 *)
              ((long)&((fwds.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = *(pointer *)
            ((long)&(fwds.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          ((long)&(revs.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11);
    oh.i.t = 2;
    oh._12_4_ = 0;
    oh.pg = (ComputationGraph *)&dist;
    cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
    *(ulong *)((long)&(i_oh.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11) =
         CONCAT44(alpha_i.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  (uint)alpha_i.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    *(uint *)((long)&((i_oh.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11) =
         (uint)alpha_i.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  this_02 = (RNNBuilder *)(sent + 0x18);
  uVar14 = 0;
  do {
    if (uVar14 == uVar9) {
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)this,&errs);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&errs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_oh.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&revs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&fwds.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_inputw.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_input.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_charinput.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charPool);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_charSum.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charxExp);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charxMExp);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charh);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charw);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_char);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_word.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      EVar25._8_8_ = extraout_RDX;
      EVar25.pg = (ComputationGraph *)this;
      return EVar25;
    }
    cnn::RNNBuilder::new_graph(this_02,(ComputationGraph *)cor);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
         ZEXT816(0) << 0x40;
    auVar22 = ZEXT1664((undefined1  [16])
                       dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._0_16_);
    cnn::RNNBuilder::start_new_sequence
              (this_02,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       &dist);
    std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
              ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist)
    ;
    if (in_stack_00000020 == '\0') {
      alpha_i.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = HIDDEN_DIM;
      x_00._M_len = 1;
      x_00._M_array = (iterator)&alpha_i;
      cnn::Dim::Dim((Dim *)&dist,x_00);
      cnn::expr::zeroes((ComputationGraph *)&oh,(Dim *)cor);
      iVar1 = 0;
      do {
        if (0xc < iVar1) break;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  (&alpha_i,__n,(allocator_type *)&dist);
        for (lVar11 = 0; dVar19 = auVar22._0_8_, lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
          cnn::expr::operator*
                    ((expr *)&combine_h,&i_oh2ohxMExp,
                     (Expression *)
                     ((long)&(i_oh.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11));
          cnn::expr::operator*((expr *)&i_lh,&oh2ohxMExp,&oh);
          cnn::expr::operator+((expr *)&alpha,&combine_h,&i_lh);
          auVar22._0_8_ = cnn::expr::tanh((expr *)&input_cols,dVar19);
          auVar22._8_56_ = extraout_var_02;
          cnn::expr::operator*((expr *)&dist,&i_u,&input_cols);
          *(pointer *)
           (CONCAT44(alpha_i.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)alpha_i.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start) + lVar11) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(uint *)(CONCAT44(alpha_i.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint)alpha_i.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 8 + lVar11) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
        }
        cnn::expr::detail::
        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&input_cols,&i_oh);
        cnn::expr::detail::
        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&dist,&alpha_i);
        cnn::expr::softmax((expr *)&alpha,(Expression *)&dist);
        cnn::expr::transpose((expr *)&i_lh,&alpha);
        cnn::expr::transpose((expr *)&i_l,&input_cols);
        cnn::expr::operator*((expr *)&combine_h,&i_lh,&i_l);
        cnn::expr::transpose((expr *)&dist,&combine_h);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        i_lh.i.t = 2;
        i_lh._12_4_ = 0;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             i_oh.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14].i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_oh.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].pg;
        i_lh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&combine_h,(initializer_list<cnn::expr::Expression> *)&i_lh);
        cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_02);
        VVar8.t = dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_;
        local_338._M_len = 3;
        oh.pg = (ComputationGraph *)
                dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_lhbias.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_lhbias.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_oh2lh.pg;
        oh.i.t = VVar8.t;
        local_338._M_array = (iterator)&dist;
        cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&i_l,&local_338);
        auVar22._0_8_ = cnn::expr::tanh((expr *)&i_lh,dVar19);
        auVar22._8_56_ = extraout_var_03;
        cnn::expr::operator*((expr *)&i_l,&i_lh2l,&i_lh);
        if (predict == (uint *)0x0) {
          bVar18 = true;
        }
        else {
          pTVar10 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
          cnn::as_vector(&dist,pTVar10);
          auVar20 = ZEXT816(0xd4b075823b6c498a);
          uVar16 = 0xffffffffffffffff;
          for (uVar17 = 0; auVar22 = ZEXT1664(auVar20),
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 != uVar17; uVar17 = uVar17 + 1) {
            auVar24._0_8_ =
                 (double)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
            auVar24._8_8_ = in_XMM2_Qb;
            dVar19 = auVar20._0_8_;
            auVar20 = vmaxsd_avx(auVar24,auVar20);
            if (dVar19 < auVar24._0_8_) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 & 0xffffffff;
          }
          ppNVar5 = (local_328->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar6 = ppNVar5[uVar14 * 3];
          lVar11 = (long)ppNVar5[uVar14 * 3 + 1] - (long)pNVar6;
          if ((ulong)(long)iVar1 < (ulong)(lVar11 >> 2)) {
            uVar13 = *(uint *)((long)(pNVar6->dim).d + (long)iVar1 * 4 + -0x20);
            if (uVar13 == (uint)uVar16) {
              auVar22 = ZEXT864((ulong)(*(double *)predict + 1.0));
              *(double *)predict = *(double *)predict + 1.0;
            }
            cnn::expr::pickneglogsoftmax((expr *)&local_338,&i_l,uVar13);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
            emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_338);
          }
          else {
            cnn::expr::pickneglogsoftmax
                      ((expr *)&local_338,&i_l,*(uint *)((long)pNVar6 + lVar11 + -4));
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
            emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_338);
          }
          iVar1 = iVar1 + 1;
          bVar18 = (uint)uVar16 != endlabel;
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&dist.super__Vector_base<float,_std::allocator<float>_>);
        }
        std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
        ~_Vector_base(&alpha_i.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     );
      } while (bVar18);
      if (overall != (uint *)0x0) {
        *overall = *overall + iVar1;
      }
      piVar7 = (int *)CONCAT71(in_stack_00000019,train);
      if (piVar7 != (int *)0x0) {
        ppNVar5 = (local_328->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *piVar7 = *piVar7 + (int)((ulong)((long)ppNVar5[uVar14 * 3 + 1] - (long)ppNVar5[uVar14 * 3])
                                 >> 2);
      }
    }
    else {
      alpha_i.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = HIDDEN_DIM;
      x._M_len = 1;
      x._M_array = (iterator)&alpha_i;
      cnn::Dim::Dim((Dim *)&dist,x);
      cnn::expr::zeroes((ComputationGraph *)&oh,(Dim *)cor);
      iVar1 = 0;
      while( true ) {
        ppNVar5 = (local_328->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)ppNVar5[uVar14 * 3 + 1] - (long)ppNVar5[uVar14 * 3] >> 2;
        if (uVar16 <= (ulong)(long)iVar1) break;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  (&alpha_i,__n,(allocator_type *)&dist);
        for (lVar11 = 0; dVar19 = auVar22._0_8_, lVar15 != lVar11; lVar11 = lVar11 + 0x10) {
          cnn::expr::operator*
                    ((expr *)&combine_h,&i_oh2ohxMExp,
                     (Expression *)
                     ((long)&(i_oh.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar11));
          cnn::expr::operator*((expr *)&i_lh,&oh2ohxMExp,&oh);
          cnn::expr::operator+((expr *)&alpha,&combine_h,&i_lh);
          auVar22._0_8_ = cnn::expr::tanh((expr *)&input_cols,dVar19);
          auVar22._8_56_ = extraout_var_00;
          cnn::expr::operator*((expr *)&dist,&i_u,&input_cols);
          *(pointer *)
           (CONCAT44(alpha_i.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)alpha_i.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start) + lVar11) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(uint *)(CONCAT44(alpha_i.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint)alpha_i.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 8 + lVar11) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
        }
        cnn::expr::detail::
        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&input_cols,&i_oh);
        cnn::expr::detail::
        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&dist,&alpha_i);
        cnn::expr::softmax((expr *)&alpha,(Expression *)&dist);
        cnn::expr::transpose((expr *)&i_lh,&alpha);
        cnn::expr::transpose((expr *)&i_l,&input_cols);
        cnn::expr::operator*((expr *)&combine_h,&i_lh,&i_l);
        cnn::expr::transpose((expr *)&dist,&combine_h);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        i_lh.i.t = 2;
        i_lh._12_4_ = 0;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             i_oh.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14].i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_oh.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].pg;
        i_lh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&combine_h,(initializer_list<cnn::expr::Expression> *)&i_lh);
        cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_02);
        VVar8.t = dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_;
        local_338._M_len = 3;
        oh.pg = (ComputationGraph *)
                dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_lhbias.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_lhbias.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_oh2lh.pg;
        oh.i.t = VVar8.t;
        local_338._M_array = (iterator)&dist;
        cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&i_l,&local_338);
        auVar22._0_8_ = cnn::expr::tanh((expr *)&i_lh,dVar19);
        auVar22._8_56_ = extraout_var_01;
        cnn::expr::operator*((expr *)&i_l,&i_lh2l,&i_lh);
        if (predict != (uint *)0x0) {
          pTVar10 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
          cnn::as_vector(&dist,pTVar10);
          auVar20 = ZEXT816(0xd4b075823b6c498a);
          uVar16 = 0xffffffffffffffff;
          for (uVar17 = 0; auVar22 = ZEXT1664(auVar20),
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 != uVar17; uVar17 = uVar17 + 1) {
            auVar23._0_8_ =
                 (double)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
            auVar23._8_8_ = in_XMM2_Qb;
            dVar19 = auVar20._0_8_;
            auVar20 = vmaxsd_avx(auVar23,auVar20);
            if (dVar19 < auVar23._0_8_) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 & 0xffffffff;
          }
          uVar13 = *(uint *)((long)((local_328->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar14 * 3]->dim).d +
                            (long)iVar1 * 4 + -0x20);
          if (uVar13 == (uint)uVar16) {
            auVar22 = ZEXT864((ulong)(*(double *)predict + 1.0));
            *(double *)predict = *(double *)predict + 1.0;
          }
          cnn::expr::pickneglogsoftmax((expr *)&local_338,&i_l,uVar13);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
          emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_338);
          iVar1 = iVar1 + 1;
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&dist.super__Vector_base<float,_std::allocator<float>_>);
        }
        std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
        ~_Vector_base(&alpha_i.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     );
      }
      if (overall != (uint *)0x0) {
        *overall = *overall + iVar1;
      }
      piVar7 = (int *)CONCAT71(in_stack_00000019,train);
      if (piVar7 != (int *)0x0) {
        *piVar7 = *piVar7 + (int)uVar16;
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    
    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 13) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }